

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_coordinate_frame(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_coordinate_frame != 0) {
    glad_glTangent3bEXT = (PFNGLTANGENT3BEXTPROC)(*load)("glTangent3bEXT");
    glad_glTangent3bvEXT = (PFNGLTANGENT3BVEXTPROC)(*load)("glTangent3bvEXT");
    glad_glTangent3dEXT = (PFNGLTANGENT3DEXTPROC)(*load)("glTangent3dEXT");
    glad_glTangent3dvEXT = (PFNGLTANGENT3DVEXTPROC)(*load)("glTangent3dvEXT");
    glad_glTangent3fEXT = (PFNGLTANGENT3FEXTPROC)(*load)("glTangent3fEXT");
    glad_glTangent3fvEXT = (PFNGLTANGENT3FVEXTPROC)(*load)("glTangent3fvEXT");
    glad_glTangent3iEXT = (PFNGLTANGENT3IEXTPROC)(*load)("glTangent3iEXT");
    glad_glTangent3ivEXT = (PFNGLTANGENT3IVEXTPROC)(*load)("glTangent3ivEXT");
    glad_glTangent3sEXT = (PFNGLTANGENT3SEXTPROC)(*load)("glTangent3sEXT");
    glad_glTangent3svEXT = (PFNGLTANGENT3SVEXTPROC)(*load)("glTangent3svEXT");
    glad_glBinormal3bEXT = (PFNGLBINORMAL3BEXTPROC)(*load)("glBinormal3bEXT");
    glad_glBinormal3bvEXT = (PFNGLBINORMAL3BVEXTPROC)(*load)("glBinormal3bvEXT");
    glad_glBinormal3dEXT = (PFNGLBINORMAL3DEXTPROC)(*load)("glBinormal3dEXT");
    glad_glBinormal3dvEXT = (PFNGLBINORMAL3DVEXTPROC)(*load)("glBinormal3dvEXT");
    glad_glBinormal3fEXT = (PFNGLBINORMAL3FEXTPROC)(*load)("glBinormal3fEXT");
    glad_glBinormal3fvEXT = (PFNGLBINORMAL3FVEXTPROC)(*load)("glBinormal3fvEXT");
    glad_glBinormal3iEXT = (PFNGLBINORMAL3IEXTPROC)(*load)("glBinormal3iEXT");
    glad_glBinormal3ivEXT = (PFNGLBINORMAL3IVEXTPROC)(*load)("glBinormal3ivEXT");
    glad_glBinormal3sEXT = (PFNGLBINORMAL3SEXTPROC)(*load)("glBinormal3sEXT");
    glad_glBinormal3svEXT = (PFNGLBINORMAL3SVEXTPROC)(*load)("glBinormal3svEXT");
    glad_glTangentPointerEXT = (PFNGLTANGENTPOINTEREXTPROC)(*load)("glTangentPointerEXT");
    glad_glBinormalPointerEXT = (PFNGLBINORMALPOINTEREXTPROC)(*load)("glBinormalPointerEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_coordinate_frame(GLADloadproc load) {
	if(!GLAD_GL_EXT_coordinate_frame) return;
	glad_glTangent3bEXT = (PFNGLTANGENT3BEXTPROC)load("glTangent3bEXT");
	glad_glTangent3bvEXT = (PFNGLTANGENT3BVEXTPROC)load("glTangent3bvEXT");
	glad_glTangent3dEXT = (PFNGLTANGENT3DEXTPROC)load("glTangent3dEXT");
	glad_glTangent3dvEXT = (PFNGLTANGENT3DVEXTPROC)load("glTangent3dvEXT");
	glad_glTangent3fEXT = (PFNGLTANGENT3FEXTPROC)load("glTangent3fEXT");
	glad_glTangent3fvEXT = (PFNGLTANGENT3FVEXTPROC)load("glTangent3fvEXT");
	glad_glTangent3iEXT = (PFNGLTANGENT3IEXTPROC)load("glTangent3iEXT");
	glad_glTangent3ivEXT = (PFNGLTANGENT3IVEXTPROC)load("glTangent3ivEXT");
	glad_glTangent3sEXT = (PFNGLTANGENT3SEXTPROC)load("glTangent3sEXT");
	glad_glTangent3svEXT = (PFNGLTANGENT3SVEXTPROC)load("glTangent3svEXT");
	glad_glBinormal3bEXT = (PFNGLBINORMAL3BEXTPROC)load("glBinormal3bEXT");
	glad_glBinormal3bvEXT = (PFNGLBINORMAL3BVEXTPROC)load("glBinormal3bvEXT");
	glad_glBinormal3dEXT = (PFNGLBINORMAL3DEXTPROC)load("glBinormal3dEXT");
	glad_glBinormal3dvEXT = (PFNGLBINORMAL3DVEXTPROC)load("glBinormal3dvEXT");
	glad_glBinormal3fEXT = (PFNGLBINORMAL3FEXTPROC)load("glBinormal3fEXT");
	glad_glBinormal3fvEXT = (PFNGLBINORMAL3FVEXTPROC)load("glBinormal3fvEXT");
	glad_glBinormal3iEXT = (PFNGLBINORMAL3IEXTPROC)load("glBinormal3iEXT");
	glad_glBinormal3ivEXT = (PFNGLBINORMAL3IVEXTPROC)load("glBinormal3ivEXT");
	glad_glBinormal3sEXT = (PFNGLBINORMAL3SEXTPROC)load("glBinormal3sEXT");
	glad_glBinormal3svEXT = (PFNGLBINORMAL3SVEXTPROC)load("glBinormal3svEXT");
	glad_glTangentPointerEXT = (PFNGLTANGENTPOINTEREXTPROC)load("glTangentPointerEXT");
	glad_glBinormalPointerEXT = (PFNGLBINORMALPOINTEREXTPROC)load("glBinormalPointerEXT");
}